

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool>::
~TypeHierarchyPropagator(TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> *this)

{
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> *this_local;
  
  SubTypes::~SubTypes(&this->subTypes);
  return;
}

Assistant:

TypeHierarchyPropagator(Module& wasm) : subTypes(wasm) {}